

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3VdbeFrameRestore(VdbeFrame *pFrame)

{
  Vdbe *p;
  sqlite3 *db;
  
  p = pFrame->v;
  closeCursorsInFrame(p);
  p->aOp = pFrame->aOp;
  p->nOp = pFrame->nOp;
  p->aMem = pFrame->aMem;
  p->nMem = pFrame->nMem;
  p->apCsr = pFrame->apCsr;
  p->nCursor = pFrame->nCursor;
  db = p->db;
  db->lastRowid = pFrame->lastRowid;
  p->nChange = pFrame->nChange;
  db->nChange = pFrame->nDbChange;
  sqlite3VdbeDeleteAuxData(db,&p->pAuxData,-1,0);
  p->pAuxData = pFrame->pAuxData;
  pFrame->pAuxData = (AuxData *)0x0;
  return pFrame->pc;
}

Assistant:

SQLITE_PRIVATE int sqlite3VdbeFrameRestore(VdbeFrame *pFrame){
  Vdbe *v = pFrame->v;
  closeCursorsInFrame(v);
  v->aOp = pFrame->aOp;
  v->nOp = pFrame->nOp;
  v->aMem = pFrame->aMem;
  v->nMem = pFrame->nMem;
  v->apCsr = pFrame->apCsr;
  v->nCursor = pFrame->nCursor;
  v->db->lastRowid = pFrame->lastRowid;
  v->nChange = pFrame->nChange;
  v->db->nChange = pFrame->nDbChange;
  sqlite3VdbeDeleteAuxData(v->db, &v->pAuxData, -1, 0);
  v->pAuxData = pFrame->pAuxData;
  pFrame->pAuxData = 0;
  return pFrame->pc;
}